

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

uchar __thiscall comparer_context::cmp<unsigned_char>(comparer_context *this,string *name)

{
  ostream *poVar1;
  uchar e;
  uchar a;
  stringstream ss;
  uchar local_1ca;
  uchar local_1c9;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  read<unsigned_char>(this,&local_1c9,&local_1ca);
  if (local_1c9 == local_1ca) {
    return local_1c9;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Expected ",9);
  local_1c8._M_dataplus._M_p._0_1_ = local_1ca;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)&local_1c8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but actual is ",0x10);
  local_1c8._M_dataplus._M_p._0_1_ = local_1c9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c8,1);
  std::__cxx11::stringbuf::str();
  failure(this,&local_1c8,name);
}

Assistant:

T cmp(const std::string& name) {
        T a,e;
        read(a,e);

        if(a != e) {
            std::stringstream ss;
            failure((ss<< "Expected " << e << ", but actual is " << a,
                ss.str()),name);
        }
    //  std::cout << name << " " << std::hex << a << std::endl;
        return a;
    }